

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O2

void __thiscall
xemmai::t_define<t_container>::f_derive<t_queue,xemmai::t_sharable>(t_define<t_container> *this)

{
  t_container *ptVar1;
  long *plVar2;
  t_object *a_value;
  
  ptVar1 = this->v_library;
  plVar2 = (long *)__tls_get_addr(&PTR_00113ed8);
  a_value = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<t_queue>>
                      (*(t_type_of<xemmai::t_object> **)(*plVar2 + 0x48),
                       (t_object *)&ptVar1[-2].v_type_pair.v_slot,&this->v_fields);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct(&ptVar1->v_type_queue,a_value);
  return;
}

Assistant:

void f_derive()
	{
		v_library->template f_type_slot<T>().f_construct(v_library->template f_type<T_super>()->template f_derive<t_type_of<T>>(t_object::f_of(v_library), v_fields));
	}